

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  bool bVar1;
  void *in_RCX;
  AssertionResult *in_RDI;
  MessageBuilder builder;
  AssertionResult *in_stack_fffffffffffffd38;
  string *this_00;
  MessageBuilder *this_01;
  AssertionResult *in_stack_fffffffffffffd50;
  SourceLineInfo *lineInfo;
  string *in_stack_fffffffffffffd58;
  MessageBuilder *in_stack_fffffffffffffd60;
  string local_288 [16];
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_fffffffffffffd88;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_fffffffffffffd90;
  string local_240 [112];
  string local_1d0 [432];
  void *local_20;
  
  *(undefined ***)&in_RDI->m_info = &PTR__AssertionStats_001f0930;
  this_01 = (MessageBuilder *)&(in_RDI->m_info).field_0x8;
  local_20 = in_RCX;
  AssertionResult::AssertionResult(in_stack_fffffffffffffd50,in_RDI);
  lineInfo = (SourceLineInfo *)&in_RDI[1].m_info.field_0x8;
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  memcpy(&in_RDI[1].m_info.lineInfo,local_20,0x30);
  bVar1 = AssertionResult::hasMessage((AssertionResult *)0x18efd0);
  if (bVar1) {
    AssertionResult::getTestMacroName_abi_cxx11_(in_stack_fffffffffffffd38);
    AssertionResult::getSourceInfo(in_stack_fffffffffffffd38);
    AssertionResult::getResultType((AssertionResult *)&(in_RDI->m_info).field_0x8);
    MessageBuilder::MessageBuilder
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,lineInfo,
               (OfType)((ulong)in_RDI >> 0x20));
    SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x18f03c);
    std::__cxx11::string::~string(local_240);
    AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffd38);
    MessageBuilder::operator<<
              (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd38);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::ostringstream::str();
    this_00 = (string *)&stack0xfffffffffffffd58;
    std::__cxx11::string::operator=(local_1d0,this_00);
    std::__cxx11::string::~string(this_00);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)lineInfo,
               (value_type *)in_RDI);
    MessageBuilder::~MessageBuilder(this_01);
  }
  return;
}

Assistant:

AssertionStats( AssertionResult const& _assertionResult,
                        std::vector<MessageInfo> const& _infoMessages,
                        Totals const& _totals )
        :   assertionResult( _assertionResult ),
            infoMessages( _infoMessages ),
            totals( _totals )
        {
            if( assertionResult.hasMessage() ) {
                // Copy message into messages list.
                // !TBD This should have been done earlier, somewhere
                MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
                builder << assertionResult.getMessage();
                builder.m_info.message = builder.m_stream.str();

                infoMessages.push_back( builder.m_info );
            }
        }